

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C++20Support.hpp
# Opt level: O1

string * std::format<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string>
                   (string *__return_storage_ptr__,string_view fmt,
                   basic_string_view<char,_std::char_traits<char>_> *ts,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1)

{
  char *pcVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  size_t sVar9;
  long lVar10;
  stringstream ss;
  long alStack_3c0 [2];
  char *local_3b0;
  long local_3a8;
  char *local_3a0;
  long alStack_398 [60];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar5 = fmt._M_str;
  sVar9 = fmt._M_len;
  uVar7 = 0;
  alStack_3c0[0] = 0x11d80a;
  memset(alStack_3c0 + 1,0,0x200);
  pcVar1 = pcVar5 + sVar9;
  pcVar4 = pcVar5;
  if (sVar9 != 0) {
    uVar7 = 0;
    pcVar3 = pcVar5;
    pcVar6 = pcVar5;
    pcVar8 = pcVar5;
    do {
      pcVar4 = pcVar8;
      if ((*pcVar8 != '}') && (pcVar4 = pcVar3, *pcVar8 == '{')) {
        if (pcVar3 == pcVar5) {
          alStack_3c0[uVar7 * 2 + 1] = (long)pcVar6 - (long)pcVar3;
          (&local_3b0)[uVar7 * 2] = pcVar3;
          uVar7 = uVar7 + 1;
        }
        else if (uVar7 < 0x20 && pcVar8 != pcVar3) {
          alStack_3c0[uVar7 * 2 + 1] = (long)(pcVar6 + ~(ulong)pcVar3);
          (&local_3b0)[uVar7 * 2] = pcVar3 + 1;
          uVar7 = uVar7 + 1;
        }
      }
      pcVar8 = pcVar8 + 1;
      pcVar6 = pcVar6 + 1;
      sVar9 = sVar9 - 1;
      pcVar3 = pcVar4;
    } while (sVar9 != 0);
  }
  pcVar4 = pcVar4 + 1;
  if (pcVar4 != pcVar1) {
    alStack_3c0[uVar7 * 2 + 1] = (long)pcVar1 - (long)pcVar4;
    (&local_3b0)[uVar7 * 2] = pcVar4;
  }
  alStack_3c0[0] = 0x11d8c3;
  std::__cxx11::stringstream::stringstream(local_1b8);
  alStack_3c0[0] = 0x11d8dc;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3b0,alStack_3c0[1]);
  alStack_3c0[0] = 0x11d8eb;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,ts->_M_str,ts->_M_len);
  alStack_3c0[0] = 0x11d8fd;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3a0,local_3a8);
  alStack_3c0[0] = 0x11d90c;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(ts_1->_M_dataplus)._M_p,ts_1->_M_string_length);
  for (lVar10 = 0x28; lVar10 != 0x208; lVar10 = lVar10 + 0x10) {
    alStack_3c0[0] = 0x11d930;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,*(char **)((long)alStack_3c0 + lVar10 + 8U),
               *(long *)((long)alStack_3c0 + lVar10));
  }
  alStack_3c0[0] = 0x11d942;
  std::__cxx11::stringbuf::str();
  alStack_3c0[0] = 0x11d956;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  alStack_3c0[0] = 0x11d963;
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string format(std::string_view fmt, auto&&... ts) {
    if (sizeof...(ts) == 0) return std::string(fmt);
    std::array<std::string_view, 32> fragments{};
    if (sizeof...(ts) > fragments.size()) throw std::length_error("format parameters count limit exceeded");
    size_t index = 0;
    auto start = fmt.cbegin(), parser = start;
    while (parser != fmt.cend()) {
        if (*parser == '{') {
            if (start == fmt.cbegin())
                fragments[index++] = std::string_view(start, static_cast<size_t>(parser - start));          /// string_view constructor with iterators is missing in Apple Clang 13
            else if (start != parser && index < fragments.size())
                fragments[index++] = std::string_view(start + 1, static_cast<size_t>(parser - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13
        }
        else if (*parser == '}')
            start = parser;
        ++parser;
    }
    if (start + 1 != fmt.cend()) fragments[index++] = std::string_view(start + 1, static_cast<size_t>(fmt.cend() - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13

    auto frag = fragments.cbegin();
    stringstream ss;
    using webfront::operator<<;
    ((ss << *frag++ << std::forward<decltype(ts)>(ts)), ...);
    while (frag != fragments.cend()) ss << *frag++;
    return ss.str();
}